

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileExists(string *filename)

{
  char *__name;
  uint uVar1;
  int iVar2;
  string *filename_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __name = (char *)std::__cxx11::string::c_str();
    iVar2 = access(__name,4);
    filename_local._7_1_ = iVar2 == 0;
  }
  else {
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool SystemTools::FileExists(const std::string& filename)
{
  if(filename.empty())
    {
    return false;
    }
#if defined(__CYGWIN__)
  // Convert filename to native windows path if possible.
  char winpath[MAX_PATH];
  if(SystemTools::PathCygwinToWin32(filename.c_str(), winpath))
    {
    return (GetFileAttributesA(winpath) != INVALID_FILE_ATTRIBUTES);
    }
  return access(filename.c_str(), R_OK) == 0;
#elif defined(_WIN32)
  return (GetFileAttributesW(
            SystemTools::ConvertToWindowsExtendedPath(filename).c_str())
          != INVALID_FILE_ATTRIBUTES);
#else
  return access(filename.c_str(), R_OK) == 0;
#endif
}